

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

ImGuiOldColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  uint uVar1;
  ImGuiOldColumns *pIVar2;
  long lVar3;
  long lVar4;
  ImGuiOldColumns local_98;
  
  uVar1 = (window->ColumnsStorage).Size;
  lVar3 = -0x88;
  do {
    lVar4 = lVar3;
    if ((ulong)(~((int)uVar1 >> 0x1f) & uVar1) * 0x88 - (lVar4 + 0x88) == 0) {
      local_98.Splitter._Channels.Data = (ImDrawChannel *)0x0;
      local_98.HostBackupClipRect.Min.y = 0.0;
      local_98.HostBackupClipRect.Max.x = 0.0;
      local_98.HostBackupClipRect.Max.y = 0.0;
      local_98.HostBackupParentWorkRect.Min.x = 0.0;
      local_98.HostBackupParentWorkRect.Min.y = 0.0;
      local_98.HostBackupParentWorkRect.Max.x = 0.0;
      local_98.HostBackupParentWorkRect.Max.y = 0.0;
      local_98._92_4_ = 0;
      local_98.Columns.Size = 0;
      local_98.Columns.Capacity = 0;
      local_98.Columns.Data = (ImGuiOldColumnData *)0x0;
      local_98.Splitter._Current = 0;
      local_98.Splitter._Count = 0;
      local_98.Splitter._Channels.Size = 0;
      local_98.Splitter._Channels.Capacity = 0;
      local_98.ID = 0;
      local_98.Flags = 0;
      local_98.IsFirstFrame = false;
      local_98.IsBeingResized = false;
      local_98._10_2_ = 0;
      local_98.Current = 0;
      local_98.Count = 0;
      local_98.OffMinX = 0.0;
      local_98.OffMaxX = 0.0;
      local_98.LineMinY = 0.0;
      local_98.LineMaxY = 0.0;
      local_98.HostCursorPosY = 0.0;
      local_98.HostCursorMaxPosX = 0.0;
      local_98.HostInitialClipRect.Min.x = 0.0;
      local_98.HostInitialClipRect.Min.y = 0.0;
      local_98.HostInitialClipRect.Max.x = 0.0;
      local_98.HostInitialClipRect.Max.y = 0.0;
      local_98.HostBackupClipRect.Min.x = 0.0;
      ImVector<ImGuiOldColumns>::push_back(&window->ColumnsStorage,&local_98);
      ImGuiOldColumns::~ImGuiOldColumns(&local_98);
      pIVar2 = (window->ColumnsStorage).Data + (long)(window->ColumnsStorage).Size + -1;
      pIVar2->ID = id;
      return pIVar2;
    }
    pIVar2 = (window->ColumnsStorage).Data;
    lVar3 = lVar4 + 0x88;
  } while (*(ImGuiID *)((long)&pIVar2[1].ID + lVar4) != id);
  return (ImGuiOldColumns *)((long)&pIVar2[1].ID + lVar4);
}

Assistant:

ImGuiOldColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiOldColumns());
    ImGuiOldColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}